

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O3

void sptk::world::bitrv208(double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = a[2];
  dVar2 = a[3];
  dVar3 = a[6];
  dVar4 = a[7];
  a[2] = a[8];
  a[3] = a[9];
  a[8] = dVar1;
  a[9] = dVar2;
  a[6] = a[0xc];
  a[7] = a[0xd];
  a[0xc] = dVar3;
  a[0xd] = dVar4;
  return;
}

Assistant:

void bitrv208(double *a) {
  double x1r, x1i, x3r, x3i, x4r, x4i, x6r, x6i;

  x1r = a[2];
  x1i = a[3];
  x3r = a[6];
  x3i = a[7];
  x4r = a[8];
  x4i = a[9];
  x6r = a[12];
  x6i = a[13];
  a[2] = x4r;
  a[3] = x4i;
  a[6] = x6r;
  a[7] = x6i;
  a[8] = x1r;
  a[9] = x1i;
  a[12] = x3r;
  a[13] = x3i;
}